

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_decoder.hpp
# Opt level: O1

int __thiscall
andyzip::brotli_decoder::transform_dictionary_word
          (brotli_decoder *this,char *buffer,uint8_t *src,int transform_idx,int copy_len,
          int ringbuffer_mask)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  int i;
  int iVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  uint8_t fermented [24];
  byte local_48 [24];
  
  lVar9 = (long)transform_idx * 0x10;
  cVar3 = (&brotli_data::table)[lVar9];
  pcVar10 = buffer;
  if (cVar3 != '\0') {
    pcVar6 = &brotli_data::table + lVar9;
    do {
      pcVar6 = pcVar6 + 1;
      *pcVar10 = cVar3;
      pcVar10 = pcVar10 + 1;
      cVar3 = *pcVar6;
    } while (cVar3 != '\0');
  }
  bVar1 = (&DAT_00126d96)[lVar9];
  if (bVar1 < 0xc) {
    if (2 < bVar1) {
      copy_len = copy_len - (bVar1 - 2);
      src = src + (bVar1 - 2);
    }
  }
  else {
    copy_len = (copy_len - (uint)bVar1) + 0xb;
  }
  if ((byte)(bVar1 - 1) < 2) {
    if (copy_len < 0x19) {
      memcpy(local_48,src,(long)copy_len);
    }
    iVar4 = 0;
    do {
      if (copy_len <= iVar4) break;
      lVar8 = (long)iVar4;
      bVar2 = src[lVar8];
      if (bVar2 < 0xc0) {
        iVar5 = 1;
        iVar7 = 1;
        if ((byte)(bVar2 + 0x9f) < 0x1a) {
LAB_00105ff8:
          iVar5 = iVar7;
          local_48[lVar8] = local_48[lVar8] ^ 0x20;
        }
      }
      else {
        if (bVar2 < 0xe0) {
          iVar7 = iVar4 + 1;
          iVar5 = 2;
        }
        else {
          iVar7 = iVar4 + 2;
          iVar5 = 3;
        }
        if (iVar7 < copy_len) {
          lVar8 = (long)iVar7;
          iVar7 = iVar5;
          goto LAB_00105ff8;
        }
      }
      iVar4 = iVar4 + iVar5;
    } while (bVar1 != 1);
    src = local_48;
  }
  if (copy_len != 0) {
    lVar8 = 0;
    do {
      pcVar10[lVar8] = src[lVar8];
      lVar8 = lVar8 + 1;
    } while (copy_len != (int)lVar8);
    pcVar10 = pcVar10 + lVar8;
  }
  cVar3 = (&DAT_00126d97)[lVar9];
  if (cVar3 != '\0') {
    pcVar6 = &DAT_00126d98 + lVar9;
    do {
      *pcVar10 = cVar3;
      pcVar10 = pcVar10 + 1;
      cVar3 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (cVar3 != '\0');
  }
  return (int)pcVar10 - (int)buffer;
}

Assistant:

int transform_dictionary_word(char *buffer, const uint8_t *src, int transform_idx, int copy_len, int ringbuffer_mask) {
      char *dest = buffer;
      auto &t = brotli_data::table[transform_idx];
      for (const char *psrc = t.prefix; *psrc; ++psrc) {
        *dest++ = *psrc;
      }

      if (t.id >= brotli_data::OmitLast1) {
        copy_len -= t.id - brotli_data::OmitLast1 + 1;
      } else if (t.id >= brotli_data::OmitFirst1) {
        copy_len -= t.id - brotli_data::OmitFirst1 + 1;
        src += t.id - brotli_data::OmitFirst1 + 1;
      }

      // fermentation (aka. case conversion)
      if (t.id == brotli_data::FermentFirst || t.id == brotli_data::FermentAll) {
        uint8_t fermented[24];
        if (copy_len <= 24) {
          memcpy(fermented, src, copy_len);
        }
  
        for (int i = 0; i < copy_len;) {
          uint8_t chr = src[i];
          if (chr < 192) {
            if (chr >= 97 && chr <= 122) {
              fermented[i] ^= 32;
            }
            ++i;
          } else if (chr < 224) {
            if (i + 1 < copy_len) {
              fermented[i+1] ^= 32;
            }
            i += 2;
          } else {
            if (i + 2 < copy_len) {
              fermented[i+2] ^= 32;
            }
            i += 3;
          }
          if (t.id == brotli_data::FermentFirst) break;
        }
        src = fermented;
      }

      for (int i = 0; i != copy_len; ++i) {
        *dest++ = *src++;
      }

      for (const char *dsrc = t.suffix; *dsrc; ++dsrc) {
        *dest++ = *dsrc;
      }

      return (int)(dest - buffer);
    }